

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avs2d_vdpu383.c
# Opt level: O0

MPP_RET hal_avs2d_vdpu383_deinit(void *hal)

{
  long lVar1;
  uint uVar2;
  Avs2dRkvRegCtx_t_conflict *reg_ctx;
  Avs2dHalCtx_t *p_hal;
  uint local_18;
  RK_U32 loop;
  RK_U32 i;
  MPP_RET ret;
  void *hal_local;
  
  loop = 0;
  lVar1 = *(long *)((long)hal + 0x5a8);
  if ((avs2d_hal_debug & 0x100) != 0) {
    _mpp_log_l(4,"hal_avs2d_vdpu383","In.","hal_avs2d_vdpu383_deinit");
  }
  if (lVar1 == 0) {
    loop = 0xfffffc16;
    if ((avs2d_hal_debug & 4) != 0) {
      _mpp_log_l(4,"hal_avs2d_vdpu383","input empty(%d).\n",(char *)0x0,0x1fa);
    }
  }
  else {
    uVar2 = 1;
    if (*(int *)((long)hal + 0x5a0) != 0) {
      uVar2 = 3;
    }
    for (local_18 = 0; local_18 < uVar2; local_18 = local_18 + 1) {
      if (*(long *)(lVar1 + 400 + (ulong)local_18 * 8) != 0) {
        mpp_buffer_put_with_caller
                  (*(MppBuffer *)(lVar1 + 400 + (ulong)local_18 * 8),"hal_avs2d_vdpu383_deinit");
        *(undefined8 *)(lVar1 + 400 + (ulong)local_18 * 8) = 0;
      }
      if (*(long *)(lVar1 + (ulong)local_18 * 0x18 + 0x10) != 0) {
        mpp_osal_free("hal_avs2d_vdpu383_deinit",*(void **)(lVar1 + (ulong)local_18 * 0x18 + 0x10));
      }
      *(undefined8 *)(lVar1 + (ulong)local_18 * 0x18 + 0x10) = 0;
    }
    if (*(long *)(lVar1 + 0x178) != 0) {
      mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 0x178),"hal_avs2d_vdpu383_deinit");
      *(undefined8 *)(lVar1 + 0x178) = 0;
    }
    if (*(long *)((long)hal + 0x28) != 0) {
      hal_bufs_deinit(*(HalBufs *)((long)hal + 0x28));
      *(undefined8 *)((long)hal + 0x28) = 0;
    }
    if (*(long *)((long)hal + 0x5a8) != 0) {
      mpp_osal_free("hal_avs2d_vdpu383_deinit",*(void **)((long)hal + 0x5a8));
    }
    *(undefined8 *)((long)hal + 0x5a8) = 0;
  }
  if ((avs2d_hal_debug & 0x100) != 0) {
    _mpp_log_l(4,"hal_avs2d_vdpu383","Out. ret %d","hal_avs2d_vdpu383_deinit",(ulong)loop);
  }
  return loop;
}

Assistant:

MPP_RET hal_avs2d_vdpu383_deinit(void *hal)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i, loop;
    Avs2dHalCtx_t *p_hal = (Avs2dHalCtx_t *)hal;
    Avs2dRkvRegCtx_t *reg_ctx = (Avs2dRkvRegCtx_t *)p_hal->reg_ctx;

    AVS2D_HAL_TRACE("In.");

    INP_CHECK(ret, NULL == reg_ctx);

    //!< malloc buffers
    loop = p_hal->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->reg_buf) : 1;
    for (i = 0; i < loop; i++) {
        if (reg_ctx->rcb_buf[i]) {
            mpp_buffer_put(reg_ctx->rcb_buf[i]);
            reg_ctx->rcb_buf[i] = NULL;
        }

        MPP_FREE(reg_ctx->reg_buf[i].regs);
    }

    if (reg_ctx->bufs) {
        mpp_buffer_put(reg_ctx->bufs);
        reg_ctx->bufs = NULL;
    }

    if (p_hal->cmv_bufs) {
        hal_bufs_deinit(p_hal->cmv_bufs);
        p_hal->cmv_bufs = NULL;
    }

    MPP_FREE(p_hal->reg_ctx);

__RETURN:
    AVS2D_HAL_TRACE("Out. ret %d", ret);
    return ret;
}